

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_variableEquivalenceValidNetwork_Test::~Validator_variableEquivalenceValidNetwork_Test
          (Validator_variableEquivalenceValidNetwork_Test *this)

{
  Validator_variableEquivalenceValidNetwork_Test *this_local;
  
  ~Validator_variableEquivalenceValidNetwork_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, variableEquivalenceValidNetwork)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();

    libcellml::ValidatorPtr validator = libcellml::Validator::create();

    model->setName("model");
    c1->setName("c1");
    c2->setName("c2");
    c3->setName("c3");

    model->addComponent(c1);
    model->addComponent(c2);
    c2->addComponent(c3);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("v1");
    v1->setUnits("dimensionless");

    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("v2");
    v2->setUnits("dimensionless");

    libcellml::VariablePtr v3 = libcellml::Variable::create();
    v3->setName("v3");
    v3->setUnits("dimensionless");

    c1->addVariable(v1);
    c2->addVariable(v2);
    c3->addVariable(v3);

    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v3);

    v1->setInterfaceType("public");
    v2->setInterfaceType("public_and_private");
    v3->setInterfaceType("public");

    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->errorCount());
}